

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall
Scine::Core::ModuleManager::Impl::LibraryAndModules::~LibraryAndModules(LibraryAndModules *this)

{
  vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
  ::~vector(unaff_retaddr);
  boost::dll::shared_library::~shared_library((shared_library *)0x12c7b6);
  return;
}

Assistant:

static boost::dll::shared_library tryLoad(const boost::filesystem::path& libraryPath) {
      boost::system::error_code error;
      boost::dll::shared_library library;

      library.load(libraryPath, error, boost::dll::load_mode::append_decorations);

      // Check for problems
      if (static_cast<bool>(error)) {
        throw std::runtime_error(error.message());
      }

      return library;
    }